

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

int __thiscall embree::TutorialApplication::main(TutorialApplication *this,int argc,char **argv)

{
  long *in_RDI;
  exception *e;
  int in_stack_0000002c;
  TutorialApplication *in_stack_00000030;
  int in_stack_ffffffffffffffac;
  Application *in_stack_ffffffffffffffb0;
  
  Application::parseCommandLine
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char **)0x13e3ea);
  (**(code **)(*in_RDI + 0x18))();
  create_device((TutorialApplication *)0x13e406);
  run(in_stack_00000030,in_stack_0000002c,(char **)e);
  return 0;
}

Assistant:

int TutorialApplication::main(int argc, char** argv) try
  {
    /* parse command line options */
    parseCommandLine(argc,argv);

    /* callback */
    postParseCommandLine();

    /* create embree device */
    create_device();
  
    /* start tutorial */
    run(argc,argv);
    return 0;
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }